

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O1

int poll_dispatch(event_base *base,timeval *tv)

{
  pollfd *__fds;
  ushort uVar1;
  uint uVar2;
  int32_t iVar3;
  void *pvVar4;
  ulong uVar5;
  int *piVar6;
  ushort uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int *piVar11;
  
  piVar6 = (int *)base->evbase;
  iVar8 = piVar6[1];
  if (base->th_base_lock == (void *)0x0) {
    piVar11 = piVar6 + 4;
LAB_002588de:
    __fds = *(pollfd **)piVar11;
    if (tv == (timeval *)0x0) {
      iVar10 = -1;
    }
    else {
      uVar5 = evutil_tv_to_msec_(tv);
      uVar9 = 0x7fffffff;
      if (uVar5 < 0x7fffffff) {
        uVar9 = uVar5;
      }
      iVar10 = (int)uVar9;
    }
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
    }
    uVar2 = poll(__fds,(long)iVar8,iVar10);
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,base->th_base_lock);
    }
    if (uVar2 == 0xffffffff) {
      piVar6 = __errno_location();
      if (*piVar6 != 4) {
        event_warn("poll");
        goto LAB_00258a05;
      }
    }
    else {
      if (event_debug_logging_mask_ != 0) {
        event_debugx_("%s: poll reports %d","poll_dispatch",(ulong)uVar2);
      }
      if (iVar8 == 0 || uVar2 == 0) {
        return 0;
      }
      iVar3 = evutil_weakrand_range_(&base->weakrand_seed,iVar8);
      iVar10 = iVar8;
      if (iVar8 < 1) {
        return 0;
      }
      do {
        iVar3 = iVar3 + 1;
        if (iVar3 == iVar8) {
          iVar3 = 0;
        }
        uVar7 = __fds[iVar3].revents;
        if (uVar7 != 0) {
          uVar1 = uVar7 | 5;
          if ((uVar7 & 0x38) == 0) {
            uVar1 = uVar7;
          }
          uVar7 = uVar1 & 4 | uVar1 * 2 & 2;
          if (uVar7 != 0) {
            evmap_io_active_(base,__fds[iVar3].fd,uVar7);
          }
        }
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    iVar8 = 0;
  }
  else {
    if (piVar6[2] == 0) {
LAB_002588c5:
      piVar11 = piVar6 + 6;
      memcpy(*(void **)(piVar6 + 6),*(void **)(piVar6 + 4),(long)iVar8 * 8);
      goto LAB_002588de;
    }
    pvVar4 = event_mm_realloc_(*(void **)(piVar6 + 6),(long)*piVar6 << 3);
    if (pvVar4 != (void *)0x0) {
      *(void **)(piVar6 + 6) = pvVar4;
      piVar6[2] = 0;
      goto LAB_002588c5;
    }
    event_warn("realloc");
LAB_00258a05:
    iVar8 = -1;
  }
  return iVar8;
}

Assistant:

static int
poll_dispatch(struct event_base *base, struct timeval *tv)
{
	int res, i, j, nfds;
	long msec = -1;
	struct pollop *pop = base->evbase;
	struct pollfd *event_set;

	poll_check_ok(pop);

	nfds = pop->nfds;

#ifndef EVENT__DISABLE_THREAD_SUPPORT
	if (base->th_base_lock) {
		/* If we're using this backend in a multithreaded setting,
		 * then we need to work on a copy of event_set, so that we can
		 * let other threads modify the main event_set while we're
		 * polling. If we're not multithreaded, then we'll skip the
		 * copy step here to save memory and time. */
		if (pop->realloc_copy) {
			struct pollfd *tmp = mm_realloc(pop->event_set_copy,
			    pop->event_count * sizeof(struct pollfd));
			if (tmp == NULL) {
				event_warn("realloc");
				return -1;
			}
			pop->event_set_copy = tmp;
			pop->realloc_copy = 0;
		}
		memcpy(pop->event_set_copy, pop->event_set,
		    sizeof(struct pollfd)*nfds);
		event_set = pop->event_set_copy;
	} else {
		event_set = pop->event_set;
	}
#else
	event_set = pop->event_set;
#endif

	if (tv != NULL) {
		msec = evutil_tv_to_msec_(tv);
		if (msec < 0 || msec > INT_MAX)
			msec = INT_MAX;
	}

	EVBASE_RELEASE_LOCK(base, th_base_lock);

	res = poll(event_set, nfds, msec);

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);

	if (res == -1) {
		if (errno != EINTR) {
			event_warn("poll");
			return (-1);
		}

		return (0);
	}

	event_debug(("%s: poll reports %d", __func__, res));

	if (res == 0 || nfds == 0)
		return (0);

	i = evutil_weakrand_range_(&base->weakrand_seed, nfds);
	for (j = 0; j < nfds; j++) {
		int what;
		if (++i == nfds)
			i = 0;
		what = event_set[i].revents;
		if (!what)
			continue;

		res = 0;

		/* If the file gets closed notify */
		if (what & (POLLHUP|POLLERR|POLLNVAL))
			what |= POLLIN|POLLOUT;
		if (what & POLLIN)
			res |= EV_READ;
		if (what & POLLOUT)
			res |= EV_WRITE;
		if (res == 0)
			continue;

		evmap_io_active_(base, event_set[i].fd, res);
	}

	return (0);
}